

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftad.cpp
# Opt level: O2

void __thiscall RandStrAtom::generate(RandStrAtom *this,wchar_t **dst)

{
  RandStrNode *pRVar1;
  wchar_t *pwVar2;
  uint32_t uVar3;
  int iVar4;
  wchar_t wVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  uint uVar9;
  wchar_t wVar10;
  RandStrRange *r;
  RandStrNode **ppRVar11;
  bool bVar12;
  
  if (this->listChars != 0) {
    uVar3 = rng_next();
    uVar7 = rand_range((ulong)uVar3,(long)this->listChars);
    ppRVar11 = &(this->super_RandStrNode).firstChild;
    while( true ) {
      pRVar1 = *ppRVar11;
      if (pRVar1 == (RandStrNode *)0x0) {
        return;
      }
      uVar9 = *(int *)((long)&pRVar1[1]._vptr_RandStrNode + 4) -
              *(int *)&pRVar1[1]._vptr_RandStrNode;
      iVar4 = (int)uVar7;
      if (iVar4 <= (int)uVar9) break;
      uVar7 = (ulong)(iVar4 + ~uVar9);
      ppRVar11 = &pRVar1->nextSibling;
    }
    wVar5 = *(int *)&pRVar1[1]._vptr_RandStrNode + iVar4;
    goto LAB_0025725d;
  }
  if (this->isLit != 0) {
    wVar5 = this->ch;
    goto LAB_0025725d;
  }
  uVar3 = rng_next();
  uVar7 = (ulong)uVar3;
  wVar5 = this->ch;
  switch(wVar5) {
  case L'a':
    uVar7 = rand_range(uVar7,0x1a);
    wVar5 = (int)uVar7 + L'a';
    break;
  case L'b':
    uVar7 = rand_range(uVar7,0x100);
    wVar5 = (wchar_t)uVar7;
    break;
  case L'c':
    uVar7 = rand_range(uVar7,0x34);
    wVar5 = (int)uVar7 + L'a';
    wVar10 = (int)uVar7 + L'\'';
    bVar12 = uVar7 < 0x1a;
    goto LAB_002573c9;
  case L'd':
    uVar7 = rand_range(uVar7,10);
    wVar5 = (int)uVar7 + L'0';
    break;
  case L'e':
  case L'f':
  case L'g':
  case L'h':
  case L'j':
  case L'k':
    goto switchD_00257291_caseD_65;
  case L'i':
    uVar7 = rand_range(uVar7,0x5f);
    wVar5 = (int)uVar7 + L' ';
    break;
  case L'l':
    uVar7 = rand_range(uVar7,0xbf);
    wVar5 = (int)uVar7 + L' ';
    wVar10 = (int)uVar7 + L'A';
    bVar12 = uVar7 < 0x5f;
LAB_002573c9:
    if (!bVar12) {
      wVar5 = wVar10;
    }
    break;
  default:
    if (wVar5 == L'A') {
      uVar7 = rand_range(uVar7,0x1a);
      wVar5 = (int)uVar7 + L'A';
    }
    else {
      if (wVar5 == L'X') {
        uVar8 = rand_range(uVar7,0x10);
        wVar10 = (int)uVar8 + L'7';
LAB_002573c5:
        wVar5 = (int)uVar8 + L'0';
        bVar12 = uVar8 < 10;
        goto LAB_002573c9;
      }
      if (wVar5 == L'z') {
        uVar7 = rand_range(uVar7,0x3e);
        iVar4 = 0x57;
        if (0x23 < uVar7) {
          iVar4 = 0x1d;
        }
        bVar12 = uVar7 < 10;
        iVar6 = 0x30;
      }
      else {
        if (wVar5 == L'x') {
          uVar8 = rand_range(uVar7,0x10);
          wVar10 = (int)uVar8 + L'W';
          goto LAB_002573c5;
        }
        if (wVar5 != L'u') {
          return;
        }
        while (iVar4 = t3_is_unichar(wVar5), iVar4 == 0) {
          uVar3 = rng_next();
          uVar7 = (ulong)uVar3;
          wVar5 = this->ch;
        }
        uVar7 = rand_range(uVar7,0xe6bf);
        iVar4 = 0x40;
        if (0xdfbf < uVar7) {
          iVar4 = 0x1940;
        }
        bVar12 = uVar7 < 0x60;
        iVar6 = 0x20;
      }
      if (!bVar12) {
        iVar6 = iVar4;
      }
      wVar5 = iVar6 + (int)uVar7;
    }
  }
LAB_0025725d:
  pwVar2 = *dst;
  *dst = pwVar2 + 1;
  *pwVar2 = wVar5;
switchD_00257291_caseD_65:
  return;
}

Assistant:

virtual void generate(VMG_ wchar_t *&dst)
    {
        /* 
         *   If we have a character list expression, choose a character from
         *   the list.  Otherwise, generate a character according to our
         *   character class code.  
         */
        wchar_t outc = L'\0';
        if (listChars != 0)
        {
            /* pick a random index in our range */
            wchar_t n = (wchar_t)rand_range(rng_next(vmg0_), listChars);

			/* find the range containing this character */
			int picked = FALSE;
            for (RandStrNode *chi = firstChild ; chi != 0 ;
                 chi = chi->nextSibling)
            {
                /* cast the child - we know it's a range node */
                RandStrRange *r = (RandStrRange *)chi;

                /* if the index is in this range, we've found it */
                if (n <= r->c2 - r->c1)
                {
					outc = r->c1 + n;
					picked = TRUE;
                    break;
                }

                /* deduct the size of this range from the index */
                n -= (r->c2 - r->c1 + 1);
			}

			/* 
			 *   if we didn't pick a character, something's wrong - return
			 *   without generating anything 
			 */
			if (!picked)
				return;
        }
        else if (isLit)
        {
            /* literal character expression */
            outc = ch;
        }
        else
        {
            /* no list, so generate a character based on the class code */
            ulong rand_val = rng_next(vmg0_);
            switch (ch)
            {
            case 'i':
                /* printable ASCII character 32-126 */
                outc = (wchar_t)rand_range(rand_val, 32, 126);
                break;
                
            case 'l':
                /* printable Latin-1 character 32-126, 160-255 */
                outc = (wchar_t)rand_range(rand_val, 32, 126, 160, 255);
                break;
                
            case 'u':
                /* 
                 *   Printable Unicode character.  This excludes undefined
                 *   character, the private use area, and the control
                 *   characters.  
                 */
                for (;;)
                {
                    /* exclude the control and private use ranges */
                    outc = (wchar_t)rand_range(
                        rand_val, 32, 127, 160, 0xDFFF, 0xF900, 0xFFFE);
                    
                    /* if it's a unicode character, we're set */
                    if (t3_is_unichar(ch))
                        break;
                    
                    /* pick a new random number */
                    rand_val = rng_next(vmg0_);
                }
                break;
                
            case 'd':
                /* decimal digit 0-9 */
                outc = (wchar_t)rand_range(rand_val, '0', '9');
                break;
                
            case 'X':
                /* upper-case hex digit 0-9 A-F */
                outc = (wchar_t)rand_range(rand_val, '0', '9', 'A', 'F');
                break;
                
            case 'x':
                /* lower-case hex digit 0-9 a-f */
                outc = (wchar_t)rand_range(rand_val, '0', '9', 'a', 'f');
                break;
                
            case 'A':
                /* letter A-Z */
                outc = (wchar_t)rand_range(rand_val, 'A', 'Z');
                break;
                
            case 'a':
                /* letter a-z */
                outc = (wchar_t)rand_range(rand_val, 'a', 'z');
                break;
                
            case 'b':
                /* random byte value 0-255 */
                outc = (wchar_t)rand_range(rand_val, 0, 255);
                break;
                
            case 'c':
                /* mixed-case letter A-Z a-z */
                outc = (wchar_t)rand_range(rand_val, 'a', 'z', 'A', 'Z');
                break;
                
            case 'z':
                /* mixed-case letter or number 0-9 a-z A-Z */
                outc = (wchar_t)rand_range(rand_val,
                                           '0', '9', 'a', 'z', 'A', 'Z');
                break;

            default:
                /* no character */
                return;
            }
        }

        /* store the output character */
        *dst++ = outc;
    }